

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O3

void __thiscall
llvm::SmallVectorTemplateBase<llvm::SMFixIt,_false>::grow
          (SmallVectorTemplateBase<llvm::SMFixIt,_false> *this,size_t MinSize)

{
  SmallVectorTemplateBase<llvm::SMFixIt,_false> *pSVar1;
  undefined8 uVar2;
  ulong uVar3;
  void *pvVar4;
  undefined8 *puVar5;
  ulong uVar6;
  long lVar7;
  long *plVar8;
  long *plVar9;
  SmallVectorTemplateBase<llvm::SMFixIt,_false> *pSVar10;
  
  if (MinSize >> 0x20 != 0) {
    report_bad_alloc_error("SmallVector capacity overflow during allocation",true);
  }
  uVar3 = (ulong)(this->super_SmallVectorTemplateCommon<llvm::SMFixIt,_void>).super_SmallVectorBase.
                 Capacity + 2;
  uVar6 = uVar3 >> 1 | uVar3;
  uVar6 = uVar6 >> 2 | uVar6;
  uVar6 = uVar6 >> 4 | uVar6;
  uVar6 = uVar6 >> 8 | uVar6;
  uVar3 = (uVar3 >> 0x20 | uVar6 >> 0x10 | uVar6) + 1;
  if (uVar3 <= MinSize) {
    uVar3 = MinSize;
  }
  if (0xfffffffe < uVar3) {
    uVar3 = 0xffffffff;
  }
  plVar8 = (long *)(uVar3 * 0x30);
  pvVar4 = malloc((size_t)plVar8);
  if (pvVar4 == (void *)0x0) {
    SmallVectorTemplateBase<llvm::SMFixIt,false>::grow();
    if (plVar8 != (long *)MinSize) {
      plVar8 = plVar8 + 4;
      do {
        if (plVar8 != (long *)plVar8[-2]) {
          operator_delete((long *)plVar8[-2],*plVar8 + 1);
        }
        plVar9 = plVar8 + 2;
        plVar8 = plVar8 + 6;
      } while (plVar9 != (long *)MinSize);
    }
    return;
  }
  pSVar10 = (SmallVectorTemplateBase<llvm::SMFixIt,_false> *)
            (this->super_SmallVectorTemplateCommon<llvm::SMFixIt,_void>).super_SmallVectorBase.
            BeginX;
  uVar6 = (ulong)(this->super_SmallVectorTemplateCommon<llvm::SMFixIt,_void>).super_SmallVectorBase.
                 Size;
  if (uVar6 != 0) {
    puVar5 = (undefined8 *)((long)pvVar4 + 0x20);
    lVar7 = uVar6 * 0x30;
    pSVar10 = pSVar10 + 2;
    do {
      uVar2 = *(undefined8 *)
               &pSVar10[-2].super_SmallVectorTemplateCommon<llvm::SMFixIt,_void>.
                super_SmallVectorBase.Size;
      puVar5[-4] = pSVar10[-2].super_SmallVectorTemplateCommon<llvm::SMFixIt,_void>.
                   super_SmallVectorBase.BeginX;
      puVar5[-3] = uVar2;
      puVar5[-2] = puVar5;
      pSVar1 = (SmallVectorTemplateBase<llvm::SMFixIt,_false> *)
               pSVar10[-1].super_SmallVectorTemplateCommon<llvm::SMFixIt,_void>.
               super_SmallVectorBase.BeginX;
      if (pSVar10 == pSVar1) {
        uVar2 = *(undefined8 *)
                 &(pSVar10->super_SmallVectorTemplateCommon<llvm::SMFixIt,_void>).
                  super_SmallVectorBase.Size;
        *puVar5 = (pSVar10->super_SmallVectorTemplateCommon<llvm::SMFixIt,_void>).
                  super_SmallVectorBase.BeginX;
        puVar5[1] = uVar2;
      }
      else {
        puVar5[-2] = pSVar1;
        *puVar5 = (pSVar10->super_SmallVectorTemplateCommon<llvm::SMFixIt,_void>).
                  super_SmallVectorBase.BeginX;
      }
      puVar5[-1] = *(undefined8 *)
                    &pSVar10[-1].super_SmallVectorTemplateCommon<llvm::SMFixIt,_void>.
                     super_SmallVectorBase.Size;
      pSVar10[-1].super_SmallVectorTemplateCommon<llvm::SMFixIt,_void>.super_SmallVectorBase.BeginX
           = pSVar10;
      pSVar10[-1].super_SmallVectorTemplateCommon<llvm::SMFixIt,_void>.super_SmallVectorBase.Size =
           0;
      pSVar10[-1].super_SmallVectorTemplateCommon<llvm::SMFixIt,_void>.super_SmallVectorBase.
      Capacity = 0;
      *(undefined1 *)
       &(pSVar10->super_SmallVectorTemplateCommon<llvm::SMFixIt,_void>).super_SmallVectorBase.BeginX
           = 0;
      puVar5 = puVar5 + 6;
      pSVar10 = pSVar10 + 3;
      lVar7 = lVar7 + -0x30;
    } while (lVar7 != 0);
    pSVar10 = (SmallVectorTemplateBase<llvm::SMFixIt,_false> *)
              (this->super_SmallVectorTemplateCommon<llvm::SMFixIt,_void>).super_SmallVectorBase.
              BeginX;
    uVar6 = (ulong)(this->super_SmallVectorTemplateCommon<llvm::SMFixIt,_void>).
                   super_SmallVectorBase.Size;
    if (uVar6 != 0) {
      lVar7 = uVar6 * 0x30;
      do {
        plVar8 = (long *)((long)&pSVar10[-1].super_SmallVectorTemplateCommon<llvm::SMFixIt,_void>.
                                 super_SmallVectorBase.BeginX + lVar7);
        plVar9 = *(long **)((long)&pSVar10[-2].super_SmallVectorTemplateCommon<llvm::SMFixIt,_void>.
                                   super_SmallVectorBase.BeginX + lVar7);
        if (plVar8 != plVar9) {
          operator_delete(plVar9,*plVar8 + 1);
        }
        lVar7 = lVar7 + -0x30;
      } while (lVar7 != 0);
      pSVar10 = (SmallVectorTemplateBase<llvm::SMFixIt,_false> *)
                (this->super_SmallVectorTemplateCommon<llvm::SMFixIt,_void>).super_SmallVectorBase.
                BeginX;
    }
  }
  if (pSVar10 != this + 1) {
    free(pSVar10);
  }
  (this->super_SmallVectorTemplateCommon<llvm::SMFixIt,_void>).super_SmallVectorBase.BeginX = pvVar4
  ;
  (this->super_SmallVectorTemplateCommon<llvm::SMFixIt,_void>).super_SmallVectorBase.Capacity =
       (uint)uVar3;
  return;
}

Assistant:

void SmallVectorTemplateBase<T, TriviallyCopyable>::grow(size_t MinSize) {
  if (MinSize > UINT32_MAX)
    report_bad_alloc_error("SmallVector capacity overflow during allocation");

  // Always grow, even from zero.
  size_t NewCapacity = size_t(NextPowerOf2(this->capacity() + 2));
  NewCapacity = std::min(std::max(NewCapacity, MinSize), size_t(UINT32_MAX));
  T *NewElts = static_cast<T*>(llvm::safe_malloc(NewCapacity*sizeof(T)));

  // Move the elements over.
  this->uninitialized_move(this->begin(), this->end(), NewElts);

  // Destroy the original elements.
  destroy_range(this->begin(), this->end());

  // If this wasn't grown from the inline copy, deallocate the old space.
  if (!this->isSmall())
    free(this->begin());

  this->BeginX = NewElts;
  this->Capacity = NewCapacity;
}